

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

shared_ptr<gui::MultilineTextBox> __thiscall
gui::MultilineTextBox::create
          (MultilineTextBox *this,shared_ptr<gui::MultilineTextBoxStyle> *style,String *name)

{
  MultilineTextBox *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::MultilineTextBox> sVar1;
  __shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (MultilineTextBox *)operator_new(0x3e0);
  std::__shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &style->super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>);
  MultilineTextBox(this_00,(shared_ptr<gui::MultilineTextBoxStyle> *)&local_40,name);
  std::__shared_ptr<gui::MultilineTextBox,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gui::MultilineTextBox,void>
            ((__shared_ptr<gui::MultilineTextBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::MultilineTextBox>)
         sVar1.super___shared_ptr<gui::MultilineTextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MultilineTextBox> MultilineTextBox::create(std::shared_ptr<MultilineTextBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<MultilineTextBox>(new MultilineTextBox(style, name));
}